

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O0

Vec3<float> Imath_3_2::closestPointOnBox<float>(Vec3<float> *p,Box<Imath_3_2::Vec3<float>_> *box)

{
  bool bVar1;
  Box<Imath_3_2::Vec3<float>_> *in_RDX;
  Vec3<float> *in_RSI;
  Vec3<float> *in_RDI;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong uVar2;
  float in_XMM1_Da;
  Vec3<float> VVar3;
  Vec3<float> d;
  Vec3<float> d2;
  Vec3<float> d1;
  Vec3<float> *q;
  undefined4 in_stack_ffffffffffffff90;
  float fVar4;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  float local_5c;
  float local_54;
  Vec3<float> local_3c;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  Box<Imath_3_2::Vec3<float>_> *local_18;
  Vec3<float> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = Box<Imath_3_2::Vec3<float>_>::isEmpty(in_RDX);
  if (bVar1) {
    Vec3<float>::Vec3(in_RDI,local_10);
    uVar2 = extraout_XMM0_Qa;
  }
  else {
    VVar3 = closestPointInBox<Imath_3_2::Vec3<float>>
                      ((Vec3<float> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (Box<Imath_3_2::Vec3<float>_> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    in_XMM1_Da = VVar3.z;
    bVar1 = Vec3<float>::operator==(in_RDI,local_10);
    uVar2 = extraout_XMM0_Qa_00;
    if (bVar1) {
      Vec3<float>::operator-
                ((Vec3<float> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      Vec3<float>::operator-
                ((Vec3<float> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (local_30 <= local_24) {
        local_54 = local_30;
      }
      else {
        local_54 = local_24;
      }
      if (local_2c <= local_20) {
        local_5c = local_2c;
      }
      else {
        local_5c = local_20;
      }
      fVar4 = local_28;
      if (local_1c < local_28) {
        fVar4 = local_1c;
      }
      Vec3<float>::Vec3(&local_3c,local_54,local_5c,fVar4);
      if ((local_3c.y <= local_3c.x) || (local_3c.z <= local_3c.x)) {
        if (local_3c.z <= local_3c.y) {
          if (local_28 <= local_1c) {
            fVar4 = (local_18->max).z;
          }
          else {
            fVar4 = (local_18->min).z;
          }
          in_RDI->z = fVar4;
          local_24 = local_1c;
        }
        else {
          if (local_2c <= local_20) {
            fVar4 = (local_18->max).y;
          }
          else {
            fVar4 = (local_18->min).y;
          }
          in_RDI->y = fVar4;
          local_24 = local_20;
        }
      }
      else {
        if (local_30 <= local_24) {
          fVar4 = (local_18->max).x;
        }
        else {
          fVar4 = (local_18->min).x;
        }
        in_RDI->x = fVar4;
      }
      uVar2 = (ulong)(uint)fVar4;
      in_XMM1_Da = local_24;
    }
  }
  VVar3.z = in_XMM1_Da;
  VVar3.x = (float)(int)uVar2;
  VVar3.y = (float)(int)(uVar2 >> 0x20);
  return VVar3;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Vec3<T>
closestPointOnBox (const Vec3<T>& p, const Box<Vec3<T>>& box) IMATH_NOEXCEPT
{
    if (box.isEmpty ()) return p;

    Vec3<T> q = closestPointInBox (p, box);

    if (q == p)
    {
        Vec3<T> d1 = p - box.min;
        Vec3<T> d2 = box.max - p;

        Vec3<T> d (
            (d1.x < d2.x) ? d1.x : d2.x,
            (d1.y < d2.y) ? d1.y : d2.y,
            (d1.z < d2.z) ? d1.z : d2.z);

        if (d.x < d.y && d.x < d.z)
        {
            q.x = (d1.x < d2.x) ? box.min.x : box.max.x;
        }
        else if (d.y < d.z)
        {
            q.y = (d1.y < d2.y) ? box.min.y : box.max.y;
        }
        else
        {
            q.z = (d1.z < d2.z) ? box.min.z : box.max.z;
        }
    }

    return q;
}